

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

bool __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::TestObjectMarkedBit
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint bitIndex;
  undefined8 *in_FS_OFFSET;
  
  if ((this->super_HeapBlock).address == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x315,"(this->address != nullptr)","this->address != nullptr");
    if (!bVar3) goto LAB_00204ff9;
    *puVar1 = 0;
  }
  if ((this->super_HeapBlock).segment == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x316,"(this->segment != nullptr)","this->segment != nullptr");
    if (!bVar3) goto LAB_00204ff9;
    *puVar1 = 0;
  }
  if (((ulong)objectAddress & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar3) goto LAB_00204ff9;
    *puVar1 = 0;
  }
  bitIndex = (uint)((ulong)objectAddress >> 4) & 0xff;
  bVar3 = IsValidBitIndex(this,bitIndex);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x319,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
    if (!bVar3) {
LAB_00204ff9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  BVar4 = BVStatic<256UL>::Test(this->markBits,bitIndex);
  return BVar4 != '\0';
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::TestObjectMarkedBit(void* objectAddress)
{
    Assert(this->address != nullptr);
    Assert(this->segment != nullptr);

    uint bitIndex = GetAddressBitIndex(objectAddress);
    Assert(IsValidBitIndex(bitIndex));

    return this->GetMarkedBitVector()->Test(bitIndex) != 0;
}